

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  uint *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  long lVar10;
  Real a;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_108;
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [4];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar4 = rhs->memused;
  *(undefined4 *)(this + 8) = 0;
  if (0 < (long)iVar4) {
    lVar14 = 0;
    do {
      pNVar9 = rhs->m_elem;
      iVar5 = *(int *)((long)(&pNVar9->val + 1) + lVar14);
      local_78 = *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x20);
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14);
      local_98 = *puVar2;
      uStack_90 = puVar2[1];
      puVar2 = (undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x10);
      local_88 = *puVar2;
      uStack_80 = puVar2[1];
      iVar6 = *(int *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14);
      cVar3 = *(char *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 4);
      fVar7 = *(fpclass_type *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 8);
      iVar8 = *(int32_t *)((long)(&(pNVar9->val).m_backend.data + 1) + lVar14 + 0xc);
      local_a8._0_8_ = *(undefined8 *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x20);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14);
      local_c8 = *(uint (*) [2])puVar1;
      auStack_c0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)((long)(pNVar9->val).m_backend.data._M_elems + lVar14 + 0x10);
      local_b8 = *(uint (*) [2])puVar1;
      auStack_b0 = *(uint (*) [2])(puVar1 + 2);
      a = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      local_108.data._M_elems[8] = local_a8[0];
      local_108.data._M_elems[9] = local_a8[1];
      local_108.data._M_elems[4] = local_b8[0];
      local_108.data._M_elems[5] = local_b8[1];
      local_108.data._M_elems[6] = auStack_b0[0];
      local_108.data._M_elems[7] = auStack_b0[1];
      local_108.data._M_elems[0] = local_c8[0];
      local_108.data._M_elems[1] = local_c8[1];
      uVar11 = local_108.data._M_elems._0_8_;
      local_108.data._M_elems[2] = auStack_c0[0];
      local_108.data._M_elems[3] = auStack_c0[1];
      local_108.neg = (bool)cVar3;
      if ((cVar3 == '\x01') &&
         (local_108.data._M_elems[0] = local_c8[0],
         local_108.data._M_elems[0] != 0 || fVar7 != cpp_dec_float_finite)) {
        local_108.neg = false;
      }
      local_108.data._M_elems._0_8_ = uVar11;
      local_108.exp = iVar6;
      local_108.fpclass = fVar7;
      local_108.prec_elem = iVar8;
      if ((fVar7 == cpp_dec_float_NaN) || (NAN(a))) {
LAB_00284de3:
        lVar10 = *(long *)(this + 0x20);
        lVar13 = (long)iVar5 * 0x38;
        *(undefined8 *)(lVar10 + 0x20 + lVar13) = local_78;
        puVar2 = (undefined8 *)(lVar10 + 0x10 + lVar13);
        *puVar2 = local_88;
        puVar2[1] = uStack_80;
        *(undefined8 *)(lVar10 + lVar13) = local_98;
        ((undefined8 *)(lVar10 + lVar13))[1] = uStack_90;
        *(int *)(lVar10 + 0x28 + lVar13) = iVar6;
        *(char *)(lVar10 + 0x2c + lVar13) = cVar3;
        *(fpclass_type *)(lVar10 + 0x30 + lVar13) = fVar7;
        *(int32_t *)(lVar10 + 0x34 + lVar13) = iVar8;
        iVar6 = *(int *)(this + 8);
        *(int *)(this + 8) = iVar6 + 1;
        *(int *)(*(long *)(this + 0x10) + (long)iVar6 * 4) = iVar5;
      }
      else {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_68,a);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_68);
        if (0 < iVar12) goto LAB_00284de3;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)((long)iVar5 * 0x38 + *(long *)(this + 0x20)),0)
        ;
      }
      lVar14 = lVar14 + 0x3c;
    } while ((long)iVar4 * 0x3c != lVar14);
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign(const SVectorBase<S>& rhs)
{
   assert(rhs.dim() <= VectorBase<R>::dim());

   int s = rhs.size();
   num = 0;

   for(int i = 0; i < s; ++i)
   {
      int k = rhs.index(i);
      S v = rhs.value(i);

      if(isZero(v, this->tolerances()->epsilon()))
         VectorBase<R>::val[k] = 0;
      else
      {
         VectorBase<R>::val[k] = v;
         idx[num++] = k;
      }
   }

   setupStatus = true;

   assert(isConsistent());

   return *this;
}